

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Product.h
# Opt level: O1

optional<covenant::DFA<covenant::Sym>_> * __thiscall
covenant::Product<covenant::Sym>::intersect_all
          (optional<covenant::DFA<covenant::Sym>_> *__return_storage_ptr__,
          Product<covenant::Sym> *this,
          vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
          *reg_langs,uint alphstart,uint alphsz)

{
  char cVar1;
  element_type *peVar2;
  shared_count sVar3;
  TerminalFactory *__tmp;
  const_iterator cVar4;
  long *plVar5;
  pointer pDVar6;
  ostream *this_00;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  dfa_t reg_lang_i;
  dfa_t reg_lang_1;
  dfa_t reg_lang_0;
  optional<covenant::DFA<covenant::Sym>_> next;
  optional<covenant::DFA<covenant::Sym>_> inter;
  dfa_t local_358;
  type local_2e8;
  shared_count sStack_2e0;
  _Base_ptr local_2d8;
  key_type local_2d0;
  dfa_t local_2b0;
  key_type local_240;
  key_type local_220;
  dfa_t local_200;
  dfa_t local_190;
  undefined1 local_120 [56];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  vector<bool,_std::allocator<bool>_> local_d0;
  undefined1 local_a8 [56];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_70;
  vector<bool,_std::allocator<bool>_> local_58;
  
  DFA<covenant::Sym>::makeDFA
            (&local_190,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start,alphstart,alphsz);
  DFA<covenant::Sym>::makeDFA
            (&local_200,
             (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,alphstart,alphsz);
  cVar1 = avy::AvyLogFlag;
  if (avy::AvyLogFlag == '\x01') {
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"verbose","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,&local_220);
    bVar9 = cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
  }
  else {
    bVar9 = false;
  }
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2)) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata 0 has ",0xf);
    plVar5 = (long *)std::ostream::operator<<
                               (&std::cout,
                                (int)((ulong)((long)local_190.trans.
                                                                                                        
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_190.trans.
                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                -0x55555555);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  cVar1 = avy::AvyLogFlag;
  if (avy::AvyLogFlag == '\x01') {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"verbose","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)avy::AvyLog_abi_cxx11_,&local_240);
    bVar9 = cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
  }
  else {
    bVar9 = false;
  }
  if ((cVar1 != '\0') &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2)) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (bVar9) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata 1 has ",0xf);
    plVar5 = (long *)std::ostream::operator<<
                               (&std::cout,
                                (int)((ulong)((long)local_200.trans.
                                                                                                        
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_200.trans.
                                                                                                      
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                -0x55555555);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
  }
  DFA<covenant::Sym>::intersection
            ((optional<covenant::DFA<covenant::Sym>_> *)local_a8,&local_190,&local_200);
  if (local_a8[0] == true) {
    local_358._tfac.px = (element_type *)local_a8._8_8_;
    local_358._tfac.pn.pi_ = (sp_counted_base *)local_a8._16_8_;
    if (local_a8._16_8_ != 0) {
      LOCK();
      *(int *)(local_a8._16_8_ + 8) = *(int *)(local_a8._16_8_ + 8) + 1;
      UNLOCK();
    }
    local_358.start = local_a8._24_4_;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::vector(&local_358.trans,
             (vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
              *)(local_a8 + 0x20));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector(&local_358.eps,&local_70);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_358.accepts,&local_58);
    pDVar6 = (reg_langs->
             super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar9 = 2 < (ulong)(((long)(reg_langs->
                               super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
                       0x6db6db6db6db6db7);
    if (bVar9) {
      local_2d8 = (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      uVar7 = 2;
      uVar8 = 3;
      do {
        DFA<covenant::Sym>::makeDFA(&local_2b0,pDVar6 + uVar7,alphstart,alphsz);
        cVar1 = avy::AvyLogFlag;
        if (avy::AvyLogFlag == '\x01') {
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"verbose","");
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)avy::AvyLog_abi_cxx11_,&local_2d0);
          bVar10 = cVar4._M_node != local_2d8;
        }
        else {
          bVar10 = false;
        }
        if ((cVar1 != '\0') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2)) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        if (bVar10) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Automata ",9);
          this_00 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(this_00," has ",5);
          plVar5 = (long *)std::ostream::operator<<
                                     (this_00,(int)((ulong)((long)local_2b0.trans.
                                                                                                                                    
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_2b0.trans.
                                                                                                                
                                                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                              -0x55555555);
          std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
          std::ostream::put((char)plVar5);
          std::ostream::flush();
        }
        DFA<covenant::Sym>::intersection
                  ((optional<covenant::DFA<covenant::Sym>_> *)local_120,&local_358,&local_2b0);
        sVar3.pi_ = local_358._tfac.pn.pi_;
        peVar2 = local_358._tfac.px;
        if (local_120[0] == false) {
          boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                    ((optional_base<covenant::DFA<covenant::Sym>_> *)local_120);
          if (local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
            operator_delete(local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
            local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
            local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
            local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
            local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          }
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_2b0.eps);
          std::
          vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
          ::~vector(&local_2b0.trans);
          boost::detail::shared_count::~shared_count(&local_2b0._tfac.pn);
          if (bVar9) {
            if (local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0)
            {
              operator_delete(local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
              local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
              local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
              local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
              local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector(&local_358.eps);
            std::
            vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
            ::~vector(&local_358.trans);
            boost::detail::shared_count::~shared_count(&local_358._tfac.pn);
            goto LAB_0014034b;
          }
          break;
        }
        if (local_120._16_8_ != 0) {
          LOCK();
          *(int *)(local_120._16_8_ + 8) = *(int *)(local_120._16_8_ + 8) + 1;
          UNLOCK();
        }
        local_358._tfac.px = (element_type *)local_120._8_8_;
        local_358._tfac.pn.pi_ = (sp_counted_base *)local_120._16_8_;
        local_2e8 = (type)peVar2;
        sStack_2e0.pi_ = sVar3.pi_;
        boost::detail::shared_count::~shared_count(&sStack_2e0);
        local_358.start = local_120._24_4_;
        std::
        vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ::operator=(&local_358.trans,
                    (vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                     *)(local_120 + 0x20));
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&local_358.eps,&local_e8);
        std::vector<bool,_std::allocator<bool>_>::operator=(&local_358.accepts,&local_d0);
        boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
                  ((optional_base<covenant::DFA<covenant::Sym>_> *)local_120);
        if (local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
          operator_delete(local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          local_2b0.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        }
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_2b0.eps);
        std::
        vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
        ::~vector(&local_2b0.trans);
        boost::detail::shared_count::~shared_count(&local_2b0._tfac.pn);
        pDVar6 = (reg_langs->
                 super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar7 = ((long)(reg_langs->
                       super__Vector_base<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pDVar6 >> 4) *
                0x6db6db6db6db6db7;
        bVar10 = uVar8 <= uVar7;
        bVar11 = uVar7 - uVar8 != 0;
        bVar9 = bVar10 && bVar11;
        uVar7 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar10 && bVar11);
    }
    (__return_storage_ptr__->super_type).m_initialized = false;
    boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::construct
              (&__return_storage_ptr__->super_type,&local_358);
    if (local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_offset = 0;
      local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset = 0;
      local_358.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_358.eps);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_358.trans);
    boost::detail::shared_count::~shared_count(&local_358._tfac.pn);
    if (!bVar9) goto LAB_0014034f;
  }
LAB_0014034b:
  (__return_storage_ptr__->super_type).m_initialized = false;
LAB_0014034f:
  boost::optional_detail::optional_base<covenant::DFA<covenant::Sym>_>::~optional_base
            ((optional_base<covenant::DFA<covenant::Sym>_> *)local_a8);
  if (local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_200.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_200.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_200.trans);
  boost::detail::shared_count::~shared_count(&local_200._tfac.pn);
  if (local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_190.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_190.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_190.trans);
  boost::detail::shared_count::~shared_count(&local_190._tfac.pn);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<dfa_t> intersect_all(const vector<dfa_t>& reg_langs, 
                                       unsigned int alphstart, 
                                       unsigned int alphsz)
  {
    dfa_t reg_lang_0 = reg_langs[0].makeDFA (alphstart, alphsz);
    dfa_t reg_lang_1 = reg_langs[1].makeDFA (alphstart, alphsz);

    LOG("verbose", std::cout << "Automata 0 has " << reg_lang_0.nStates() << endl);
    LOG("verbose", std::cout << "Automata 1 has " << reg_lang_1.nStates() << endl);

    boost::optional<dfa_t> inter  = dfa_t::intersection(reg_lang_0, reg_lang_1);
    bool result = (inter ? true : false);
    if (result)
    {
      dfa_t prev = *inter;

      for(unsigned int i=2; i < reg_langs.size(); i++)
      {
        dfa_t reg_lang_i = reg_langs[i].makeDFA (alphstart, alphsz);

        LOG ("verbose", 
             cout << "Automata " << i << " has " << reg_lang_i.nStates() << endl);

        boost::optional<dfa_t> next = dfa_t::intersection(prev, reg_lang_i);

        result &= (next ? true : false);

        if (!result)
          break;
        
        prev = *next;
      }

      if (result)
        return boost::optional<dfa_t> (prev);
    }
    return boost::optional<dfa_t> ();
  }